

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
* picobench::report::get_problem_space_view
            (map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
             *__return_storage_ptr__,suite *s)

{
  bool bVar1;
  reference pbVar2;
  value_type local_98;
  mapped_type *local_68;
  mapped_type *pvbs;
  benchmark_problem_space *d;
  const_iterator __end3;
  const_iterator __begin3;
  vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
  *__range3;
  benchmark *bm;
  const_iterator __end2;
  const_iterator __begin2;
  vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_> *__range2;
  suite *s_local;
  map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  *res;
  
  std::
  map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  ::map(__return_storage_ptr__);
  __end2 = std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
           ::begin(&s->benchmarks);
  bm = (benchmark *)
       std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>::end
                 (&s->benchmarks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
                                     *)&bm), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
             ::operator*(&__end2);
    __end3 = std::
             vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
             ::begin(&pbVar2->data);
    d = (benchmark_problem_space *)
        std::
        vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
        ::end(&pbVar2->data);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_picobench::report::benchmark_problem_space_*,_std::vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>_>
                                       *)&d), bVar1) {
      pvbs = (mapped_type *)
             __gnu_cxx::
             __normal_iterator<const_picobench::report::benchmark_problem_space_*,_std::vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>_>
             ::operator*(&__end3);
      local_68 = std::
                 map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)pvbs);
      local_98.name = pbVar2->name;
      local_98.is_baseline = (bool)(pbVar2->is_baseline & 1);
      local_98.total_time_ns =
           (int64_t)(pvbs->
                    super__Vector_base<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      local_98.result =
           (result_t)
           (pvbs->
           super__Vector_base<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
      ::push_back(local_68,&local_98);
      __gnu_cxx::
      __normal_iterator<const_picobench::report::benchmark_problem_space_*,_std::vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_picobench::report::benchmark_*,_std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::map<int, std::vector<problem_space_benchmark>> get_problem_space_view(const suite& s)
    {
        std::map<int, std::vector<problem_space_benchmark>> res;
        for (auto& bm : s.benchmarks)
        {
            for (auto& d : bm.data)
            {
                auto& pvbs = res[d.dimension];
                pvbs.push_back({ bm.name, bm.is_baseline, d.total_time_ns, d.result });
            }
        }
        return res;
    }